

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

locateresult __thiscall
tetgenmesh::slocate(tetgenmesh *this,point searchpt,face *searchsh,int aflag,int cflag,int rflag)

{
  int *piVar1;
  int iVar2;
  shellface *pppdVar3;
  bool bVar4;
  uint uVar5;
  locateresult lVar6;
  shellface *pppdVar7;
  long lVar8;
  ulong uVar9;
  shellface ppdVar10;
  int *piVar11;
  int iVar12;
  shellface ppdVar13;
  shellface ppdVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double n [3];
  double local_48;
  double dStack_40;
  double local_38;
  
  pppdVar3 = searchsh->sh;
  iVar12 = searchsh->shver;
  ppdVar14 = pppdVar3[sorgpivot[iVar12]];
  ppdVar10 = pppdVar3[sdestpivot[iVar12]];
  ppdVar13 = pppdVar3[sapexpivot[iVar12]];
  if (aflag == 0) {
    calculateabovepoint4(this,(point)ppdVar14,(point)ppdVar10,(point)ppdVar13,searchpt);
  }
  piVar1 = &searchsh->shver;
  dVar15 = orient3d((double *)ppdVar14,(double *)ppdVar10,(double *)ppdVar13,this->dummypoint);
  if (dVar15 <= 0.0) {
    if ((dVar15 == 0.0) && (!NAN(dVar15))) {
      return UNKNOWN;
    }
    uVar5 = *piVar1;
  }
  else {
    uVar5 = *piVar1 ^ 1;
    *piVar1 = uVar5;
  }
  iVar12 = 3;
  while( true ) {
    ppdVar14 = searchsh->sh[sorgpivot[(int)uVar5]];
    ppdVar10 = searchsh->sh[sdestpivot[(int)uVar5]];
    dVar15 = orient3d((double *)ppdVar14,(double *)ppdVar10,this->dummypoint,searchpt);
    iVar2 = searchsh->shver;
    if (0.0 < dVar15) break;
    uVar5 = snextpivot[iVar2];
    *piVar1 = uVar5;
    iVar12 = iVar12 + -1;
    if (iVar12 == 0) {
      return UNKNOWN;
    }
  }
  ppdVar13 = searchsh->sh[sapexpivot[iVar2]];
  if (ppdVar13 == (shellface)searchpt) {
    lVar8 = (long)snextpivot[iVar2];
  }
  else {
    do {
      dVar15 = orient3d((double *)ppdVar10,(double *)ppdVar13,this->dummypoint,searchpt);
      dVar16 = orient3d((double *)ppdVar13,(double *)ppdVar14,this->dummypoint,searchpt);
      if (0.0 <= dVar15) {
        piVar11 = snextpivot;
        if (dVar16 < 0.0) goto LAB_00126778;
        if (dVar15 <= 0.0) {
          iVar12 = snextpivot[*piVar1];
          if (dVar16 <= 0.0) {
            *piVar1 = snextpivot[iVar12];
            return ONVERTEX;
          }
LAB_00126884:
          *piVar1 = iVar12;
          lVar6 = ONEDGE;
          bVar4 = false;
        }
        else {
          if (dVar16 <= 0.0) {
            iVar12 = snextpivot[snextpivot[*piVar1]];
            goto LAB_00126884;
          }
          lVar6 = ONFACE;
          bVar4 = true;
        }
        if (rflag == 0) {
          return lVar6;
        }
        pppdVar3 = searchsh->sh;
        lVar8 = (long)searchsh->shver;
        ppdVar14 = pppdVar3[sorgpivot[lVar8]];
        ppdVar10 = pppdVar3[sdestpivot[lVar8]];
        ppdVar13 = pppdVar3[sapexpivot[lVar8]];
        facenormal((tetgenmesh *)snextpivot,(point)ppdVar14,(point)ppdVar10,(point)ppdVar13,
                   &local_48,1,(double *)0x0);
        dVar17 = SQRT(local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40);
        facenormal((tetgenmesh *)piVar11,(point)ppdVar10,(point)ppdVar13,searchpt,&local_48,1,
                   (double *)0x0);
        dVar18 = local_38;
        dVar22 = dStack_40;
        dVar16 = local_48;
        dVar15 = this->b->epsilon;
        facenormal((tetgenmesh *)piVar11,(point)ppdVar13,(point)ppdVar14,searchpt,&local_48,1,
                   (double *)0x0);
        auVar19._0_8_ = local_48 * local_48 + dStack_40 * dStack_40;
        auVar19._8_8_ = dVar16 * dVar16 + dVar22 * dVar22;
        auVar20._8_8_ = dVar18 * dVar18 + auVar19._8_8_;
        auVar20._0_8_ = local_38 * local_38 + auVar19._0_8_;
        auVar20 = sqrtpd(auVar19,auVar20);
        auVar21._8_8_ = dVar17;
        auVar21._0_8_ = dVar17;
        auVar21 = divpd(auVar20,auVar21);
        dVar16 = (double)(-(ulong)(dVar15 <= auVar21._0_8_) & auVar20._0_8_);
        dVar22 = (double)(-(ulong)(dVar15 <= auVar21._8_8_) & auVar20._8_8_);
        if (bVar4) {
          facenormal((tetgenmesh *)piVar11,(point)ppdVar14,(point)ppdVar10,searchpt,&local_48,1,
                     (double *)0x0);
          dVar18 = SQRT(local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40);
          if (((dVar18 != 0.0) || (NAN(dVar18))) && (dVar15 <= dVar18 / dVar17)) {
            if (dVar22 == 0.0) {
              iVar12 = snextpivot[lVar8];
              if ((dVar16 == 0.0) && (!NAN(dVar16))) {
                iVar12 = snextpivot[iVar12];
                goto LAB_00126830;
              }
            }
            else {
              if (dVar16 != 0.0) {
                return ONFACE;
              }
              if (NAN(dVar16)) {
                return ONFACE;
              }
              iVar12 = snextpivot[snextpivot[lVar8]];
            }
            *piVar1 = iVar12;
            return ONEDGE;
          }
        }
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          return (dVar16 == 0.0) + ONEDGE;
        }
        goto LAB_00126828;
      }
      piVar11 = piVar1;
      if ((dVar16 < 0.0) &&
         (uVar9 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar9,
         (uVar9 & 1) != 0)) {
LAB_00126778:
        piVar11 = snextpivot + *piVar1;
      }
      iVar12 = snextpivot[*piVar11];
      searchsh->shver = iVar12;
      pppdVar3 = searchsh->sh;
      if ((cflag == 0) && (pppdVar3[(long)(iVar12 >> 1) + 6] != (shellface)0x0)) {
        return ENCSEGMENT;
      }
      pppdVar7 = (shellface *)((ulong)pppdVar3[iVar12 >> 1] & 0xfffffffffffffff8);
      if (pppdVar7 == (shellface *)0x0) {
        return OUTSIDE;
      }
      uVar5 = (uint)pppdVar3[iVar12 >> 1] & 7;
      uVar5 = pppdVar7[sorgpivot[uVar5]] != pppdVar3[sdestpivot[iVar12]] ^ uVar5;
      searchsh->sh = pppdVar7;
      searchsh->shver = uVar5;
      uVar9 = (ulong)(uVar5 * 4);
      ppdVar14 = pppdVar7[*(int *)((long)sorgpivot + uVar9)];
      ppdVar10 = pppdVar7[*(int *)((long)sdestpivot + uVar9)];
      ppdVar13 = pppdVar7[*(int *)((long)sapexpivot + uVar9)];
    } while (ppdVar13 != (shellface)searchpt);
    lVar8 = (long)snextpivot[uVar5];
  }
LAB_00126828:
  iVar12 = snextpivot[lVar8];
LAB_00126830:
  *piVar1 = iVar12;
  return ONVERTEX;
}

Assistant:

enum tetgenmesh::locateresult tetgenmesh::slocate(point searchpt, 
  face* searchsh, int aflag, int cflag, int rflag)
{
  face neighsh;
  point pa, pb, pc;
  enum locateresult loc;
  enum {MOVE_BC, MOVE_CA} nextmove;
  REAL ori, ori_bc, ori_ca;
  int i;

  pa = sorg(*searchsh);
  pb = sdest(*searchsh);
  pc = sapex(*searchsh);

  if (!aflag) {
    // No above point is given. Calculate an above point for this facet.
    calculateabovepoint4(pa, pb, pc, searchpt);
  }

  // 'dummypoint' is given. Make sure it is above [a,b,c]
  ori = orient3d(pa, pb, pc, dummypoint);
  if (ori > 0) {
    sesymself(*searchsh); // Reverse the face orientation.
  } else if (ori == 0.0) {
    // This case should not happen theoretically. But... 
    return UNKNOWN; 
  }

  // Find an edge of the face s.t. p lies on its right-hand side (CCW).
  for (i = 0; i < 3; i++) {
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    ori = orient3d(pa, pb, dummypoint, searchpt);
    if (ori > 0) break;
    senextself(*searchsh);
  }
  if (i == 3) {
    return UNKNOWN;
  }

  pc = sapex(*searchsh);

  if (pc == searchpt) {
    senext2self(*searchsh);
    return ONVERTEX;
  }

  while (1) {

    ori_bc = orient3d(pb, pc, dummypoint, searchpt);
    ori_ca = orient3d(pc, pa, dummypoint, searchpt);

    if (ori_bc < 0) {
      if (ori_ca < 0) { // (--)
        // Any of the edges is a viable move.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_BC;
        }
      } else { // (-#)
        // Edge [b, c] is viable.
        nextmove = MOVE_BC;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        // Edge [c, a] is viable.
        nextmove = MOVE_CA;
      } else {
        if (ori_bc > 0) {
          if (ori_ca > 0) { // (++)
            loc = ONFACE;  // Inside [a, b, c].
            break;
          } else { // (+0)
            senext2self(*searchsh); // On edge [c, a].
            loc = ONEDGE;
            break;
          }
        } else { // ori_bc == 0
          if (ori_ca > 0) { // (0+)
            senextself(*searchsh); // On edge [b, c].
            loc = ONEDGE;
            break;
          } else { // (00)
            // p is coincident with vertex c. 
            senext2self(*searchsh);
            return ONVERTEX;
          }
        }
      }
    }

    // Move to the next face.
    if (nextmove == MOVE_BC) {
      senextself(*searchsh);
    } else {
      senext2self(*searchsh);
    }
    if (!cflag) {
      // NON-convex case. Check if we will cross a boundary.
      if (isshsubseg(*searchsh)) {
        return ENCSEGMENT;
      }
    }
    spivot(*searchsh, neighsh);
    if (neighsh.sh == NULL) {
      return OUTSIDE; // A hull edge.
    }
    // Adjust the edge orientation.
    if (sorg(neighsh) != sdest(*searchsh)) {
      sesymself(neighsh);
    }

    // Update the newly discovered face and its endpoints.
    *searchsh = neighsh;
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    if (pc == searchpt) {
      senext2self(*searchsh);
      return ONVERTEX;
    }

  } // while (1)

  // assert(loc == ONFACE || loc == ONEDGE);


  if (rflag) {
    // Round the locate result before return.
    REAL n[3], area_abc, area_abp, area_bcp, area_cap;

    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    facenormal(pa, pb, pc, n, 1, NULL);
    area_abc = sqrt(dot(n, n));

    facenormal(pb, pc, searchpt, n, 1, NULL);
    area_bcp = sqrt(dot(n, n));
    if ((area_bcp / area_abc) < b->epsilon) {
      area_bcp = 0; // Rounding.
    }

    facenormal(pc, pa, searchpt, n, 1, NULL);
    area_cap = sqrt(dot(n, n));
    if ((area_cap / area_abc) < b->epsilon) {
      area_cap = 0; // Rounding
    }

    if ((loc == ONFACE) || (loc == OUTSIDE)) {
      facenormal(pa, pb, searchpt, n, 1, NULL);
      area_abp = sqrt(dot(n, n));
      if ((area_abp / area_abc) < b->epsilon) {
        area_abp = 0; // Rounding
      }
    } else { // loc == ONEDGE
      area_abp = 0;
    }

    if (area_abp == 0) {
      if (area_bcp == 0) {
        senextself(*searchsh); 
        loc = ONVERTEX; // p is close to b.
      } else {
        if (area_cap == 0) {
          loc = ONVERTEX; // p is close to a.
        } else {
          loc = ONEDGE; // p is on edge [a,b].
        }
      }
    } else if (area_bcp == 0) {
      if (area_cap == 0) {
        senext2self(*searchsh); 
        loc = ONVERTEX; // p is close to c.
      } else {
        senextself(*searchsh);
        loc = ONEDGE; // p is on edge [b,c].
      }
    } else if (area_cap == 0) {
      senext2self(*searchsh);
      loc = ONEDGE; // p is on edge [c,a].
    } else {
      loc = ONFACE; // p is on face [a,b,c].
    }
  } // if (rflag)

  return loc;
}